

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_field.cc
# Opt level: O0

FieldGenerator *
google::protobuf::compiler::javanano::FieldGeneratorMap::MakeGenerator
          (FieldDescriptor *field,Params *params,int *next_has_bit_index)

{
  int iVar1;
  bool bVar2;
  JavaType JVar3;
  Descriptor *descriptor;
  OneofDescriptor *pOVar4;
  JavaType java_type;
  int *next_has_bit_index_local;
  Params *params_local;
  FieldDescriptor *field_local;
  
  JVar3 = GetJavaType(field);
  bVar2 = FieldDescriptor::is_repeated(field);
  if (bVar2) {
    if (JVar3 == JAVATYPE_ENUM) {
      field_local = (FieldDescriptor *)operator_new(0x60);
      RepeatedEnumFieldGenerator::RepeatedEnumFieldGenerator
                ((RepeatedEnumFieldGenerator *)field_local,field,params);
    }
    else if (JVar3 == JAVATYPE_MESSAGE) {
      descriptor = FieldDescriptor::message_type(field);
      bVar2 = IsMapEntry(descriptor);
      if (bVar2) {
        field_local = (FieldDescriptor *)operator_new(0x48);
        MapFieldGenerator::MapFieldGenerator((MapFieldGenerator *)field_local,field,params);
      }
      else {
        field_local = (FieldDescriptor *)operator_new(0x48);
        RepeatedMessageFieldGenerator::RepeatedMessageFieldGenerator
                  ((RepeatedMessageFieldGenerator *)field_local,field,params);
      }
    }
    else {
      field_local = (FieldDescriptor *)operator_new(0x48);
      RepeatedPrimitiveFieldGenerator::RepeatedPrimitiveFieldGenerator
                ((RepeatedPrimitiveFieldGenerator *)field_local,field,params);
    }
  }
  else {
    pOVar4 = FieldDescriptor::containing_oneof(field);
    if (pOVar4 == (OneofDescriptor *)0x0) {
      bVar2 = Params::optional_field_accessors(params);
      if (((bVar2) && (bVar2 = FieldDescriptor::is_optional(field), bVar2)) &&
         (JVar3 != JAVATYPE_MESSAGE)) {
        if (JVar3 == JAVATYPE_ENUM) {
          field_local = (FieldDescriptor *)operator_new(0x60);
          iVar1 = *next_has_bit_index;
          *next_has_bit_index = iVar1 + 1;
          AccessorEnumFieldGenerator::AccessorEnumFieldGenerator
                    ((AccessorEnumFieldGenerator *)field_local,field,params,iVar1);
        }
        else {
          field_local = (FieldDescriptor *)operator_new(0x48);
          iVar1 = *next_has_bit_index;
          *next_has_bit_index = iVar1 + 1;
          AccessorPrimitiveFieldGenerator::AccessorPrimitiveFieldGenerator
                    ((AccessorPrimitiveFieldGenerator *)field_local,field,params,iVar1);
        }
      }
      else if (JVar3 == JAVATYPE_ENUM) {
        field_local = (FieldDescriptor *)operator_new(0x60);
        EnumFieldGenerator::EnumFieldGenerator((EnumFieldGenerator *)field_local,field,params);
      }
      else if (JVar3 == JAVATYPE_MESSAGE) {
        field_local = (FieldDescriptor *)operator_new(0x48);
        MessageFieldGenerator::MessageFieldGenerator
                  ((MessageFieldGenerator *)field_local,field,params);
      }
      else {
        field_local = (FieldDescriptor *)operator_new(0x48);
        PrimitiveFieldGenerator::PrimitiveFieldGenerator
                  ((PrimitiveFieldGenerator *)field_local,field,params);
      }
    }
    else if ((JVar3 == JAVATYPE_ENUM) || (JVar3 != JAVATYPE_MESSAGE)) {
      field_local = (FieldDescriptor *)operator_new(0x48);
      PrimitiveOneofFieldGenerator::PrimitiveOneofFieldGenerator
                ((PrimitiveOneofFieldGenerator *)field_local,field,params);
    }
    else {
      field_local = (FieldDescriptor *)operator_new(0x48);
      MessageOneofFieldGenerator::MessageOneofFieldGenerator
                ((MessageOneofFieldGenerator *)field_local,field,params);
    }
  }
  return (FieldGenerator *)field_local;
}

Assistant:

FieldGenerator* FieldGeneratorMap::MakeGenerator(const FieldDescriptor* field,
    const Params &params, int* next_has_bit_index) {
  JavaType java_type = GetJavaType(field);
  if (field->is_repeated()) {
    switch (java_type) {
      case JAVATYPE_MESSAGE:
        if (IsMapEntry(field->message_type())) {
          return new MapFieldGenerator(field, params);
        } else {
          return new RepeatedMessageFieldGenerator(field, params);
        }
      case JAVATYPE_ENUM:
        return new RepeatedEnumFieldGenerator(field, params);
      default:
        return new RepeatedPrimitiveFieldGenerator(field, params);
    }
  } else if (field->containing_oneof()) {
    switch (java_type) {
      case JAVATYPE_MESSAGE:
        return new MessageOneofFieldGenerator(field, params);
      case JAVATYPE_ENUM:
      default:
        return new PrimitiveOneofFieldGenerator(field, params);
    }
  } else if (params.optional_field_accessors() && field->is_optional()
      && java_type != JAVATYPE_MESSAGE) {
    // We need a has-bit for each primitive/enum field because their default
    // values could be same as explicitly set values. But we don't need it
    // for a message field because they have no defaults and Nano uses 'null'
    // for unset messages, which cannot be set explicitly.
    switch (java_type) {
      case JAVATYPE_ENUM:
        return new AccessorEnumFieldGenerator(
            field, params, (*next_has_bit_index)++);
      default:
        return new AccessorPrimitiveFieldGenerator(
            field, params, (*next_has_bit_index)++);
    }
  } else {
    switch (java_type) {
      case JAVATYPE_MESSAGE:
        return new MessageFieldGenerator(field, params);
      case JAVATYPE_ENUM:
        return new EnumFieldGenerator(field, params);
      default:
        return new PrimitiveFieldGenerator(field, params);
    }
  }
}